

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O3

void event_signal_missile(game_event_type type,object *obj,_Bool seen,wchar_t y,wchar_t x)

{
  event_handler_entry *peVar1;
  game_event_data data;
  game_event_data local_48;
  
  local_48.missile.obj = obj;
  local_48.missile.seen = seen;
  local_48.bolt.ox = y;
  local_48.birthstage.n_choices = x;
  for (peVar1 = event_handlers[type]; peVar1 != (event_handler_entry *)0x0; peVar1 = peVar1->next) {
    (*peVar1->fn)(type,&local_48,peVar1->user);
  }
  return;
}

Assistant:

void event_signal_missile(game_event_type type,
						  struct object *obj,
						  bool seen,
						  int y,
						  int x)
{
	game_event_data data;
	data.missile.obj = obj;
	data.missile.seen = seen;
	data.missile.y = y;
	data.missile.x = x;

	game_event_dispatch(type, &data);
}